

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::genRandomBlendState
               (Random *rng,BlendState *blendState)

{
  undefined4 uVar1;
  deBool dVar2;
  deUint32 dVar3;
  deBool dVar4;
  deBool dVar5;
  deBool dVar6;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *pEVar7;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar8;
  undefined1 auVar9 [16];
  deUint8 local_50;
  BlendFunc local_40;
  BlendFunc BStack_38;
  
  dVar2 = deRandom_getBool(&rng->m_rnd);
  if (dVar2 == 1) {
    dVar2 = deRandom_getBool(&rng->m_rnd);
    (blendState->enableBlend).field_1.m_data[0] = dVar2 == 1;
    (blendState->enableBlend).m_ptr = (bool *)&(blendState->enableBlend).field_1;
  }
  dVar2 = deRandom_getBool(&rng->m_rnd);
  if (dVar2 == 1) {
    dVar2 = deRandom_getBool(&rng->m_rnd);
    if (dVar2 == 1) {
      dVar3 = deRandom_getUint32(&rng->m_rnd);
      local_50 = '\x01';
      local_40.src = *(undefined4 *)(&DAT_01c92870 + (ulong)(dVar3 % 5) * 4);
      pEVar7 = (blendState->blendEq).m_ptr;
      if (pEVar7 == (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                     *)0x0) {
        (blendState->blendEq).field_1.m_data[0] = '\x01';
      }
      else {
LAB_01672791:
        pEVar7->m_isFirst = true;
        (pEVar7->field_1).m_first = (uint *)0x0;
        (blendState->blendEq).field_1.m_data[0] = local_50;
        if (local_50 == '\0') goto LAB_016727ca;
      }
      *(deUint32 *)((long)&(blendState->blendEq).field_1 + 0x10) = local_40.src;
    }
    else {
      dVar3 = deRandom_getUint32(&rng->m_rnd);
      uVar1 = *(undefined4 *)(&DAT_01c92870 + (ulong)(dVar3 % 5) * 4);
      dVar3 = deRandom_getUint32(&rng->m_rnd);
      local_50 = '\0';
      local_40 = (BlendFunc)CONCAT44(*(undefined4 *)(&DAT_01c92870 + (ulong)(dVar3 % 5) * 4),uVar1);
      pEVar7 = (blendState->blendEq).m_ptr;
      if (pEVar7 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                     *)0x0) goto LAB_01672791;
      (blendState->blendEq).field_1.m_data[0] = '\0';
LAB_016727ca:
      *(BlendFunc *)((long)&(blendState->blendEq).field_1 + 0x10) = local_40;
    }
    *(undefined1 **)((long)&(blendState->blendEq).field_1 + 8) =
         (undefined1 *)((long)&(blendState->blendEq).field_1 + 0x10);
    (blendState->blendEq).m_ptr =
         (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
         &(blendState->blendEq).field_1;
  }
  dVar2 = deRandom_getBool(&rng->m_rnd);
  if (dVar2 != 1) goto LAB_0167289d;
  dVar2 = deRandom_getBool(&rng->m_rnd);
  if (dVar2 == 1) {
    local_40 = getRandomBlendFunc(rng);
    local_50 = '\x01';
    pEVar8 = (blendState->blendFunc).m_ptr;
    if (pEVar8 == (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                   *)0x0) {
      (blendState->blendFunc).field_1.m_data[0] = '\x01';
    }
    else {
LAB_01672852:
      pEVar8->m_isFirst = true;
      (pEVar8->field_1).m_first = (BlendFunc *)0x0;
      (blendState->blendFunc).field_1.m_data[0] = local_50;
      if (local_50 == '\0') goto LAB_0167288d;
    }
    *(BlendFunc *)((long)&(blendState->blendFunc).field_1 + 0x10) = local_40;
  }
  else {
    local_40 = getRandomBlendFunc(rng);
    BStack_38 = getRandomBlendFunc(rng);
    local_50 = '\0';
    pEVar8 = (blendState->blendFunc).m_ptr;
    if (pEVar8 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                   *)0x0) goto LAB_01672852;
    (blendState->blendFunc).field_1.m_data[0] = '\0';
LAB_0167288d:
    *(BlendFunc *)((long)&(blendState->blendFunc).field_1 + 0x10) = local_40;
    *(BlendFunc *)((long)&(blendState->blendFunc).field_1 + 0x18) = BStack_38;
  }
  *(undefined1 **)((long)&(blendState->blendFunc).field_1 + 8) =
       (undefined1 *)((long)&(blendState->blendFunc).field_1 + 0x10);
  (blendState->blendFunc).m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)&(blendState->blendFunc).field_1;
LAB_0167289d:
  dVar2 = deRandom_getBool(&rng->m_rnd);
  if (dVar2 == 1) {
    dVar2 = deRandom_getBool(&rng->m_rnd);
    dVar4 = deRandom_getBool(&rng->m_rnd);
    dVar5 = deRandom_getBool(&rng->m_rnd);
    dVar6 = deRandom_getBool(&rng->m_rnd);
    auVar9._0_4_ = -(uint)(dVar2 == 1);
    auVar9._4_4_ = -(uint)(dVar5 == 1);
    auVar9._8_4_ = -(uint)(dVar4 == 1);
    auVar9._12_4_ = -(uint)(dVar6 == 1);
    auVar9 = packssdw(auVar9,auVar9);
    auVar9 = packsswb(auVar9,auVar9);
    *(uint *)&(blendState->colorMask).field_1 = auVar9._0_4_ & (uint)DAT_01b89df0;
    (blendState->colorMask).m_ptr = (Vector<bool,_4> *)&(blendState->colorMask).field_1;
  }
  return;
}

Assistant:

void genRandomBlendState (de::Random& rng, BlendState& blendState)
{
	if (rng.getBool())
		blendState.enableBlend = rng.getBool();

	if (rng.getBool())
	{
		if (rng.getBool())
			blendState.blendEq = getRandomBlendEq(rng);
		else
		{
			const BlendEq	rgb		= getRandomBlendEq(rng);
			const BlendEq	alpha	= getRandomBlendEq(rng);

			blendState.blendEq		= SeparateBlendEq(rgb, alpha);
		}
	}

	if (rng.getBool())
	{
		if (rng.getBool())
			blendState.blendFunc = getRandomBlendFunc(rng);
		else
		{
			const BlendFunc	rgb		= getRandomBlendFunc(rng);
			const BlendFunc	alpha	= getRandomBlendFunc(rng);

			blendState.blendFunc	= SeparateBlendFunc(rgb, alpha);
		}
	}

	if (rng.getBool())
	{
		const bool red		= rng.getBool();
		const bool green	= rng.getBool();
		const bool blue		= rng.getBool();
		const bool alpha	= rng.getBool();

		blendState.colorMask = BVec4(red, blue, green, alpha);
	}
}